

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IMC_Generator.cpp
# Opt level: O0

void __thiscall
nigel::IMC_Generator::generateMoveAB
          (IMC_Generator *this,OperationCombination comb,shared_ptr<nigel::IM_Operator> *lOp,
          shared_ptr<nigel::IM_Operator> *rOp,shared_ptr<nigel::Token> *token)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  bool bVar3;
  element_type *peVar4;
  bool bVar5;
  bool local_e31;
  bool local_dd1;
  bool local_d99;
  shared_ptr<nigel::IM_Operator> local_ba0;
  shared_ptr<nigel::IM_SFR> local_b90;
  shared_ptr<nigel::IM_Operator> local_b80;
  shared_ptr<nigel::IM_Operator> local_b70;
  shared_ptr<nigel::IM_SFR> local_b60;
  shared_ptr<nigel::IM_Operator> local_b50;
  shared_ptr<nigel::IM_Operator> local_b40;
  shared_ptr<nigel::IM_SFR> local_b30;
  shared_ptr<nigel::IM_Operator> local_b20;
  shared_ptr<nigel::IM_Operator> local_b10;
  shared_ptr<nigel::IM_Operator> local_b00;
  shared_ptr<nigel::IM_SFR> local_af0;
  shared_ptr<nigel::IM_Operator> local_ae0;
  IM_Operator local_ad0;
  shared_ptr<nigel::IM_SFR> local_ab0;
  shared_ptr<nigel::IM_Operator> local_aa0;
  shared_ptr<nigel::IM_Operator> local_a90;
  shared_ptr<nigel::IM_Operator> local_a80;
  shared_ptr<nigel::IM_Operator> local_a70;
  shared_ptr<nigel::IM_Operator> local_a60;
  shared_ptr<nigel::IM_Operator> local_a50;
  shared_ptr<nigel::IM_SFR> local_a40;
  shared_ptr<nigel::IM_Operator> local_a30;
  IM_Operator local_a20;
  shared_ptr<nigel::IM_Operator> local_a00;
  shared_ptr<nigel::IM_Operator> local_9f0;
  IM_Operator local_9e0;
  shared_ptr<nigel::IM_Operator> local_9c0;
  shared_ptr<nigel::IM_Operator> local_9b0;
  shared_ptr<nigel::IM_Operator> local_9a0;
  shared_ptr<nigel::IM_Operator> local_990;
  shared_ptr<nigel::IM_SFR> local_980;
  shared_ptr<nigel::IM_Operator> local_970;
  shared_ptr<nigel::Token> local_960;
  shared_ptr<nigel::IM_Operator> local_950;
  shared_ptr<nigel::IM_Operator> local_940;
  shared_ptr<nigel::IM_Operator> local_930;
  shared_ptr<nigel::IM_SFR> local_920;
  shared_ptr<nigel::IM_Operator> local_910;
  shared_ptr<nigel::IM_Operator> local_900;
  IM_Operator local_8f0;
  shared_ptr<nigel::IM_Operator> local_8d0;
  shared_ptr<nigel::IM_Operator> local_8c0;
  shared_ptr<nigel::IM_Operator> local_8b0;
  shared_ptr<nigel::IM_SFR> local_8a0;
  shared_ptr<nigel::IM_Operator> local_890;
  shared_ptr<nigel::IM_Operator> local_880;
  IM_Operator local_870;
  shared_ptr<nigel::IM_Operator> local_850;
  shared_ptr<nigel::IM_SFR> local_840;
  shared_ptr<nigel::IM_Operator> local_830;
  shared_ptr<nigel::IM_Operator> local_820;
  IM_Operator local_810;
  shared_ptr<nigel::IM_Operator> local_7f0;
  shared_ptr<nigel::IM_Operator> local_7e0;
  IM_Operator local_7d0;
  shared_ptr<nigel::IM_Operator> local_7b0;
  shared_ptr<nigel::IM_Operator> local_7a0;
  shared_ptr<nigel::IM_Operator> local_790;
  IM_Operator local_780;
  shared_ptr<nigel::IM_Operator> local_760;
  IM_Operator local_750;
  shared_ptr<nigel::IM_Operator> local_730;
  shared_ptr<nigel::IM_Operator> local_720;
  shared_ptr<nigel::IM_SFR> local_710;
  shared_ptr<nigel::IM_Operator> local_700;
  shared_ptr<nigel::IM_Operator> local_6f0;
  IM_Operator local_6e0;
  shared_ptr<nigel::IM_Operator> local_6c0;
  shared_ptr<nigel::IM_Operator> local_6b0;
  shared_ptr<nigel::IM_Operator> local_6a0;
  shared_ptr<nigel::IM_Operator> local_690;
  shared_ptr<nigel::IM_SFR> local_680;
  shared_ptr<nigel::IM_Operator> local_670;
  IM_Operator local_660;
  shared_ptr<nigel::IM_Operator> local_640;
  shared_ptr<nigel::IM_Operator> local_630;
  shared_ptr<nigel::IM_SFR> local_620;
  shared_ptr<nigel::IM_Operator> local_610;
  IM_Operator local_600;
  shared_ptr<nigel::IM_Operator> local_5e0;
  shared_ptr<nigel::IM_Operator> local_5d0;
  shared_ptr<nigel::IM_Operator> local_5c0;
  shared_ptr<nigel::IM_SFR> local_5b0;
  shared_ptr<nigel::IM_Operator> local_5a0;
  shared_ptr<nigel::IM_Operator> local_590;
  byte local_579;
  undefined1 local_578 [32];
  shared_ptr<nigel::IM_Operator> local_558;
  shared_ptr<nigel::IM_Operator> local_548;
  shared_ptr<nigel::IM_Operator> local_538;
  shared_ptr<nigel::IM_Operator> local_528;
  shared_ptr<nigel::IM_Operator> local_518;
  shared_ptr<nigel::IM_SFR> local_508;
  shared_ptr<nigel::IM_Operator> local_4f8;
  shared_ptr<nigel::IM_Operator> local_4e8;
  byte local_4d1;
  undefined1 local_4d0 [16];
  IM_Operator local_4c0;
  shared_ptr<nigel::IM_Operator> local_4a0;
  shared_ptr<nigel::IM_Operator> local_490;
  shared_ptr<nigel::IM_SFR> local_480;
  shared_ptr<nigel::IM_Operator> local_470;
  shared_ptr<nigel::IM_Operator> local_460;
  byte local_449;
  undefined1 local_448 [16];
  IM_Operator local_438;
  shared_ptr<nigel::IM_Operator> local_418;
  shared_ptr<nigel::IM_Operator> local_408;
  shared_ptr<nigel::IM_SFR> local_3f8;
  shared_ptr<nigel::IM_Operator> local_3e8;
  shared_ptr<nigel::IM_Operator> local_3d8;
  shared_ptr<nigel::IM_Operator> local_3c8;
  shared_ptr<nigel::IM_Operator> local_3b8;
  shared_ptr<nigel::IM_Operator> local_3a8;
  shared_ptr<nigel::IM_Operator> local_398;
  byte local_381;
  undefined1 local_380 [32];
  shared_ptr<nigel::IM_Operator> local_360;
  shared_ptr<nigel::IM_Operator> local_350;
  shared_ptr<nigel::IM_Operator> local_340;
  shared_ptr<nigel::IM_Operator> local_330;
  shared_ptr<nigel::IM_Operator> local_320;
  shared_ptr<nigel::IM_SFR> local_310;
  shared_ptr<nigel::IM_Operator> local_300;
  shared_ptr<nigel::IM_Operator> local_2f0;
  shared_ptr<nigel::IM_Operator> local_2e0;
  shared_ptr<nigel::IM_Operator> local_2d0;
  shared_ptr<nigel::IM_Operator> local_2c0;
  byte local_2a9;
  undefined1 local_2a8 [16];
  IM_Operator local_298;
  shared_ptr<nigel::IM_Operator> local_278;
  shared_ptr<nigel::IM_Operator> local_268;
  shared_ptr<nigel::IM_SFR> local_258;
  shared_ptr<nigel::IM_Operator> local_248;
  shared_ptr<nigel::IM_Operator> local_238;
  shared_ptr<nigel::IM_Operator> local_228;
  shared_ptr<nigel::IM_Operator> local_218;
  shared_ptr<nigel::IM_Operator> local_208;
  byte local_1f1;
  undefined1 local_1f0 [16];
  IM_Operator local_1e0;
  shared_ptr<nigel::IM_Operator> local_1c0;
  shared_ptr<nigel::IM_SFR> local_1b0;
  shared_ptr<nigel::IM_Operator> local_1a0;
  shared_ptr<nigel::IM_Operator> local_190;
  shared_ptr<nigel::IM_Operator> local_180;
  byte local_169;
  undefined1 local_168 [32];
  shared_ptr<nigel::IM_SFR> local_148;
  shared_ptr<nigel::IM_Operator> local_138;
  shared_ptr<nigel::IM_Operator> local_128;
  shared_ptr<nigel::IM_Operator> local_118;
  shared_ptr<nigel::IM_Operator> local_108;
  shared_ptr<nigel::IM_Operator> local_f8;
  shared_ptr<nigel::IM_Operator> local_e8;
  byte local_d1;
  undefined1 local_d0 [16];
  IM_Operator local_c0;
  shared_ptr<nigel::IM_Operator> local_a0;
  shared_ptr<nigel::IM_SFR> local_90;
  shared_ptr<nigel::IM_Operator> local_80;
  shared_ptr<nigel::IM_Operator> local_70;
  byte local_5d;
  undefined1 local_50 [16];
  undefined1 local_40 [24];
  shared_ptr<nigel::Token> *token_local;
  shared_ptr<nigel::IM_Operator> *rOp_local;
  shared_ptr<nigel::IM_Operator> *lOp_local;
  IMC_Generator *pIStack_10;
  OperationCombination comb_local;
  IMC_Generator *this_local;
  
  local_40._16_8_ = token;
  token_local = (shared_ptr<nigel::Token> *)rOp;
  rOp_local = lOp;
  lOp_local._4_4_ = comb;
  pIStack_10 = this;
  if (comb == vv) {
    std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               lOp);
    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_40);
    peVar4 = std::__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_40);
    local_5d = 0;
    bVar5 = false;
    if (*(int *)&(peVar4->super_IM_Operator).field_0x1c == 0) {
      std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)rOp);
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_50);
      local_5d = 1;
      peVar4 = std::
               __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_50);
      bVar5 = *(int *)&(peVar4->super_IM_Operator).field_0x1c == 0;
    }
    if ((local_5d & 1) != 0) {
      std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)local_50);
    }
    std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)local_40);
    if (bVar5) {
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_70,rOp);
      IM_SFR::getSFR((SFR)&local_90);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_80,&local_90);
      addCmd(this,mov_adr_adr,&local_70,&local_80);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_80);
      std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_90);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_70);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_a0,lOp);
      p_Var1 = (__weak_count<(__gnu_cxx::_Lock_policy)2> *)
               ((long)&local_c0.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                       super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> + 8);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr
                ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
      addCmd(this,mov_a_adr,&local_a0,(shared_ptr<nigel::IM_Operator> *)p_Var1);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                ((shared_ptr<nigel::IM_Operator> *)
                 ((long)&local_c0.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                         super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> + 8));
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_a0);
    }
    else {
      std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)lOp);
      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)(local_d0 + 0x10));
      peVar4 = std::
               __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(local_d0 + 0x10));
      local_d1 = 0;
      bVar5 = false;
      if (*(int *)&(peVar4->super_IM_Operator).field_0x1c == 1) {
        std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)rOp);
        IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_d0);
        local_d1 = 1;
        peVar4 = std::
                 __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_d0);
        bVar5 = *(int *)&(peVar4->super_IM_Operator).field_0x1c == 0;
      }
      if ((local_d1 & 1) != 0) {
        std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)local_d0)
        ;
      }
      std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                ((shared_ptr<nigel::IM_Variable> *)(local_d0 + 0x10));
      if (bVar5) {
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_e8,lOp);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_f8,(nullptr_t)0x0);
        addCmd(this,mov_dptr_const,&local_e8,&local_f8);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_f8);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_e8);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_108,(nullptr_t)0x0);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_118,(nullptr_t)0x0);
        addCmd(this,movx_a_dptr,&local_108,&local_118);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_118);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_108);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_128,rOp);
        IM_SFR::getSFR((SFR)&local_148);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_138,&local_148);
        addCmd(this,mov_adr_adr,&local_128,&local_138);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_138);
        std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_148);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_128);
      }
      else {
        std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)lOp);
        IM_Operator::as<nigel::IM_Variable>((IM_Operator *)(local_168 + 0x10));
        peVar4 = std::
                 __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)(local_168 + 0x10));
        local_169 = 0;
        bVar3 = IM_Variable::isOnStack(peVar4);
        bVar5 = false;
        if (bVar3) {
          std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)rOp);
          IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_168);
          local_169 = 1;
          peVar4 = std::
                   __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_168);
          bVar5 = *(int *)&(peVar4->super_IM_Operator).field_0x1c == 0;
        }
        if ((local_169 & 1) != 0) {
          std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                    ((shared_ptr<nigel::IM_Variable> *)local_168);
        }
        std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                  ((shared_ptr<nigel::IM_Variable> *)(local_168 + 0x10));
        if (bVar5) {
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_180,lOp);
          generateLoadStackR0(this,&local_180);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_180);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_190,rOp);
          IM_SFR::getSFR((SFR)&local_1b0);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_1a0,&local_1b0)
          ;
          addCmd(this,mov_adr_adr,&local_190,&local_1a0);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_1a0);
          std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_1b0);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_190);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_1c0,(nullptr_t)0x0);
          p_Var1 = (__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&local_1e0.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                           super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> + 8);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr
                    ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
          addCmd(this,mov_a_atr0,&local_1c0,(shared_ptr<nigel::IM_Operator> *)p_Var1);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                    ((shared_ptr<nigel::IM_Operator> *)
                     ((long)&local_1e0.super_enable_shared_from_this<nigel::IM_Operator>.
                             _M_weak_this.
                             super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> + 8));
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_1c0);
        }
        else {
          std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)lOp);
          IM_Operator::as<nigel::IM_Variable>((IM_Operator *)(local_1f0 + 0x10));
          peVar4 = std::
                   __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)(local_1f0 + 0x10));
          local_1f1 = 0;
          bVar5 = false;
          if (*(int *)&(peVar4->super_IM_Operator).field_0x1c == 0) {
            std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)rOp);
            IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_1f0);
            local_1f1 = 1;
            peVar4 = std::
                     __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_1f0);
            bVar5 = *(int *)&(peVar4->super_IM_Operator).field_0x1c == 1;
          }
          if ((local_1f1 & 1) != 0) {
            std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                      ((shared_ptr<nigel::IM_Variable> *)local_1f0);
          }
          std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                    ((shared_ptr<nigel::IM_Variable> *)(local_1f0 + 0x10));
          if (bVar5) {
            std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_208,rOp);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_218,(nullptr_t)0x0);
            addCmd(this,mov_dptr_const,&local_208,&local_218);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_218);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_208);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_228,(nullptr_t)0x0);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_238,(nullptr_t)0x0);
            addCmd(this,movx_a_dptr,&local_228,&local_238);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_238);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_228);
            IM_SFR::getSFR((SFR)&local_258);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>
                      (&local_248,&local_258);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_268,(nullptr_t)0x0);
            addCmd(this,mov_adr_a,&local_248,&local_268);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_268);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_248);
            std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_258);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_278,lOp);
            p_Var1 = (__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)&local_298.super_enable_shared_from_this<nigel::IM_Operator>.
                             _M_weak_this.
                             super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> + 8);
            std::shared_ptr<nigel::IM_Operator>::shared_ptr
                      ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
            addCmd(this,mov_a_adr,&local_278,(shared_ptr<nigel::IM_Operator> *)p_Var1);
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                      ((shared_ptr<nigel::IM_Operator> *)
                       ((long)&local_298.super_enable_shared_from_this<nigel::IM_Operator>.
                               _M_weak_this.
                               super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> + 8)
                      );
            std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_278);
          }
          else {
            std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)lOp);
            IM_Operator::as<nigel::IM_Variable>((IM_Operator *)(local_2a8 + 0x10));
            peVar4 = std::
                     __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)(local_2a8 + 0x10));
            local_2a9 = 0;
            bVar5 = false;
            if (*(int *)&(peVar4->super_IM_Operator).field_0x1c == 1) {
              std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)rOp);
              IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_2a8);
              local_2a9 = 1;
              peVar4 = std::
                       __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_2a8);
              bVar5 = *(int *)&(peVar4->super_IM_Operator).field_0x1c == 1;
            }
            if ((local_2a9 & 1) != 0) {
              std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                        ((shared_ptr<nigel::IM_Variable> *)local_2a8);
            }
            std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                      ((shared_ptr<nigel::IM_Variable> *)(local_2a8 + 0x10));
            if (bVar5) {
              std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_2c0,rOp);
              std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_2d0,(nullptr_t)0x0);
              addCmd(this,mov_dptr_const,&local_2c0,&local_2d0);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_2d0);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_2c0);
              std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_2e0,(nullptr_t)0x0);
              std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_2f0,(nullptr_t)0x0);
              addCmd(this,movx_a_dptr,&local_2e0,&local_2f0);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_2f0);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_2e0);
              IM_SFR::getSFR((SFR)&local_310);
              std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>
                        (&local_300,&local_310);
              std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_320,(nullptr_t)0x0);
              addCmd(this,mov_adr_a,&local_300,&local_320);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_320);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_300);
              std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_310);
              std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_330,lOp);
              std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_340,(nullptr_t)0x0);
              addCmd(this,mov_dptr_const,&local_330,&local_340);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_340);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_330);
              std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_350,(nullptr_t)0x0);
              std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_360,(nullptr_t)0x0);
              addCmd(this,movx_a_dptr,&local_350,&local_360);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_360);
              std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_350);
            }
            else {
              std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)lOp);
              IM_Operator::as<nigel::IM_Variable>((IM_Operator *)(local_380 + 0x10));
              peVar4 = std::
                       __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)(local_380 + 0x10));
              local_381 = 0;
              bVar3 = IM_Variable::isOnStack(peVar4);
              bVar5 = false;
              if (bVar3) {
                std::
                __shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)rOp);
                IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_380);
                local_381 = 1;
                peVar4 = std::
                         __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_380);
                bVar5 = *(int *)&(peVar4->super_IM_Operator).field_0x1c == 1;
              }
              if ((local_381 & 1) != 0) {
                std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                          ((shared_ptr<nigel::IM_Variable> *)local_380);
              }
              std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                        ((shared_ptr<nigel::IM_Variable> *)(local_380 + 0x10));
              if (bVar5) {
                std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_398,lOp);
                generateLoadStackR0(this,&local_398);
                std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_398);
                std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_3a8,rOp);
                std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_3b8,(nullptr_t)0x0);
                addCmd(this,mov_dptr_const,&local_3a8,&local_3b8);
                std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_3b8);
                std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_3a8);
                std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_3c8,(nullptr_t)0x0);
                std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_3d8,(nullptr_t)0x0);
                addCmd(this,movx_a_dptr,&local_3c8,&local_3d8);
                std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_3d8);
                std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_3c8);
                IM_SFR::getSFR((SFR)&local_3f8);
                std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>
                          (&local_3e8,&local_3f8);
                std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_408,(nullptr_t)0x0);
                addCmd(this,mov_adr_a,&local_3e8,&local_408);
                std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_408);
                std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_3e8);
                std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_3f8);
                std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_418,(nullptr_t)0x0);
                p_Var1 = (__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                         ((long)&local_438.super_enable_shared_from_this<nigel::IM_Operator>.
                                 _M_weak_this.
                                 super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2> +
                         8);
                std::shared_ptr<nigel::IM_Operator>::shared_ptr
                          ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
                addCmd(this,mov_a_atr0,&local_418,(shared_ptr<nigel::IM_Operator> *)p_Var1);
                std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                          ((shared_ptr<nigel::IM_Operator> *)
                           ((long)&local_438.super_enable_shared_from_this<nigel::IM_Operator>.
                                   _M_weak_this.
                                   super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                           + 8));
                std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_418);
              }
              else {
                std::
                __shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)lOp);
                IM_Operator::as<nigel::IM_Variable>((IM_Operator *)(local_448 + 0x10));
                peVar4 = std::
                         __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)(local_448 + 0x10));
                local_449 = 0;
                local_d99 = false;
                if (*(int *)&(peVar4->super_IM_Operator).field_0x1c == 0) {
                  std::
                  __shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)rOp);
                  IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_448);
                  local_449 = 1;
                  peVar4 = std::
                           __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_448);
                  local_d99 = IM_Variable::isOnStack(peVar4);
                }
                if ((local_449 & 1) != 0) {
                  std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                            ((shared_ptr<nigel::IM_Variable> *)local_448);
                }
                std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                          ((shared_ptr<nigel::IM_Variable> *)(local_448 + 0x10));
                if (local_d99 == false) {
                  std::
                  __shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)lOp);
                  IM_Operator::as<nigel::IM_Variable>((IM_Operator *)(local_4d0 + 0x10));
                  peVar4 = std::
                           __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)(local_4d0 + 0x10));
                  local_4d1 = 0;
                  local_dd1 = false;
                  if (*(int *)&(peVar4->super_IM_Operator).field_0x1c == 1) {
                    std::
                    __shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)rOp);
                    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_4d0);
                    local_4d1 = 1;
                    peVar4 = std::
                             __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)local_4d0);
                    local_dd1 = IM_Variable::isOnStack(peVar4);
                  }
                  if ((local_4d1 & 1) != 0) {
                    std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                              ((shared_ptr<nigel::IM_Variable> *)local_4d0);
                  }
                  std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                            ((shared_ptr<nigel::IM_Variable> *)(local_4d0 + 0x10));
                  if (local_dd1 == false) {
                    std::
                    __shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    ::operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                  *)lOp);
                    IM_Operator::as<nigel::IM_Variable>((IM_Operator *)(local_578 + 0x10));
                    peVar4 = std::
                             __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)(local_578 + 0x10));
                    local_579 = 0;
                    bVar5 = IM_Variable::isOnStack(peVar4);
                    local_e31 = false;
                    if (bVar5) {
                      std::
                      __shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)rOp);
                      IM_Operator::as<nigel::IM_Variable>((IM_Operator *)local_578);
                      local_579 = 1;
                      peVar4 = std::
                               __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                             *)local_578);
                      local_e31 = IM_Variable::isOnStack(peVar4);
                    }
                    if ((local_579 & 1) != 0) {
                      std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                                ((shared_ptr<nigel::IM_Variable> *)local_578);
                    }
                    std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                              ((shared_ptr<nigel::IM_Variable> *)(local_578 + 0x10));
                    if (local_e31 != false) {
                      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_590,rOp);
                      generateLoadStackR0(this,&local_590);
                      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_590);
                      IM_SFR::getSFR((SFR)&local_5b0);
                      std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>
                                (&local_5a0,&local_5b0);
                      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_5c0,(nullptr_t)0x0);
                      addCmd(this,mov_adr_atr0,&local_5a0,&local_5c0);
                      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_5c0);
                      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_5a0);
                      std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_5b0);
                      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_5d0,lOp);
                      generateLoadStackR0(this,&local_5d0);
                      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_5d0);
                      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_5e0,(nullptr_t)0x0);
                      p_Var1 = &local_600.super_enable_shared_from_this<nigel::IM_Operator>.
                                _M_weak_this.
                                super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount;
                      std::shared_ptr<nigel::IM_Operator>::shared_ptr
                                ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
                      addCmd(this,mov_a_atr0,&local_5e0,(shared_ptr<nigel::IM_Operator> *)p_Var1);
                      std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                                ((shared_ptr<nigel::IM_Operator> *)
                                 &local_600.super_enable_shared_from_this<nigel::IM_Operator>.
                                  _M_weak_this.
                                  super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
                      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_5e0);
                    }
                  }
                  else {
                    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_4e8,rOp);
                    generateLoadStackR0(this,&local_4e8);
                    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_4e8);
                    IM_SFR::getSFR((SFR)&local_508);
                    std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>
                              (&local_4f8,&local_508);
                    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_518,(nullptr_t)0x0);
                    addCmd(this,mov_adr_atr0,&local_4f8,&local_518);
                    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_518);
                    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_4f8);
                    std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_508);
                    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_528,lOp);
                    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_538,(nullptr_t)0x0);
                    addCmd(this,mov_dptr_const,&local_528,&local_538);
                    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_538);
                    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_528);
                    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_548,(nullptr_t)0x0);
                    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_558,(nullptr_t)0x0);
                    addCmd(this,movx_a_dptr,&local_548,&local_558);
                    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_558);
                    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_548);
                  }
                }
                else {
                  std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_460,rOp);
                  generateLoadStackR0(this,&local_460);
                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_460);
                  IM_SFR::getSFR((SFR)&local_480);
                  std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>
                            (&local_470,&local_480);
                  std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_490,(nullptr_t)0x0);
                  addCmd(this,mov_adr_atr0,&local_470,&local_490);
                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_490);
                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_470);
                  std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_480);
                  std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_4a0,lOp);
                  p_Var1 = (__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                           ((long)&local_4c0.super_enable_shared_from_this<nigel::IM_Operator>.
                                   _M_weak_this.
                                   super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                           + 8);
                  std::shared_ptr<nigel::IM_Operator>::shared_ptr
                            ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
                  addCmd(this,mov_a_adr,&local_4a0,(shared_ptr<nigel::IM_Operator> *)p_Var1);
                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                            ((shared_ptr<nigel::IM_Operator> *)
                             ((long)&local_4c0.super_enable_shared_from_this<nigel::IM_Operator>.
                                     _M_weak_this.
                                     super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>
                             + 8));
                  std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_4a0);
                }
              }
            }
          }
        }
      }
    }
  }
  else if (comb == vc) {
    std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               lOp);
    IM_Operator::as<nigel::IM_Variable>(&local_600);
    peVar4 = std::__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_600);
    iVar2 = *(int *)&(peVar4->super_IM_Operator).field_0x1c;
    std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)&local_600);
    if (iVar2 == 0) {
      IM_SFR::getSFR((SFR)&local_620);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_610,&local_620);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_630,rOp);
      addCmd(this,mov_adr_const,&local_610,&local_630);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_630);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_610);
      std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_620);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_640,lOp);
      p_Var1 = &local_660.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::shared_ptr<nigel::IM_Operator>::shared_ptr
                ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
      addCmd(this,mov_a_adr,&local_640,(shared_ptr<nigel::IM_Operator> *)p_Var1);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                ((shared_ptr<nigel::IM_Operator> *)
                 &local_660.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                  super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_640);
    }
    else {
      std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)lOp);
      IM_Operator::as<nigel::IM_Variable>(&local_660);
      peVar4 = std::
               __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_660);
      iVar2 = *(int *)&(peVar4->super_IM_Operator).field_0x1c;
      std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)&local_660)
      ;
      if (iVar2 == 1) {
        IM_SFR::getSFR((SFR)&local_680);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_670,&local_680);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_690,rOp);
        addCmd(this,mov_adr_const,&local_670,&local_690);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_690);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_670);
        std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_680);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_6a0,lOp);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_6b0,(nullptr_t)0x0);
        addCmd(this,mov_dptr_const,&local_6a0,&local_6b0);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_6b0);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_6a0);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_6c0,(nullptr_t)0x0);
        p_Var1 = &local_6e0.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                  super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        std::shared_ptr<nigel::IM_Operator>::shared_ptr
                  ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
        addCmd(this,movx_a_dptr,&local_6c0,(shared_ptr<nigel::IM_Operator> *)p_Var1);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                  ((shared_ptr<nigel::IM_Operator> *)
                   &local_6e0.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                    super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_6c0);
      }
      else {
        std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)lOp);
        IM_Operator::as<nigel::IM_Variable>(&local_6e0);
        peVar4 = std::
                 __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_6e0);
        bVar5 = IM_Variable::isOnStack(peVar4);
        std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                  ((shared_ptr<nigel::IM_Variable> *)&local_6e0);
        if (bVar5) {
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_6f0,lOp);
          generateLoadStackR0(this,&local_6f0);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_6f0);
          IM_SFR::getSFR((SFR)&local_710);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_700,&local_710)
          ;
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_720,rOp);
          addCmd(this,mov_adr_const,&local_700,&local_720);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_720);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_700);
          std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_710);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_730,(nullptr_t)0x0);
          p_Var1 = &local_750.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                    super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          std::shared_ptr<nigel::IM_Operator>::shared_ptr
                    ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
          addCmd(this,mov_a_atr0,&local_730,(shared_ptr<nigel::IM_Operator> *)p_Var1);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                    ((shared_ptr<nigel::IM_Operator> *)
                     &local_750.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                      super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_730);
        }
      }
    }
  }
  else if (comb == vt) {
    std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               lOp);
    IM_Operator::as<nigel::IM_Variable>(&local_750);
    peVar4 = std::__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_750);
    iVar2 = *(int *)&(peVar4->super_IM_Operator).field_0x1c;
    std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)&local_750);
    if (iVar2 == 0) {
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_760,lOp);
      p_Var1 = &local_780.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::shared_ptr<nigel::IM_Operator>::shared_ptr
                ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
      addCmd(this,mov_a_adr,&local_760,(shared_ptr<nigel::IM_Operator> *)p_Var1);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                ((shared_ptr<nigel::IM_Operator> *)
                 &local_780.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                  super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_760);
    }
    else {
      std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)lOp);
      IM_Operator::as<nigel::IM_Variable>(&local_780);
      peVar4 = std::
               __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_780);
      iVar2 = *(int *)&(peVar4->super_IM_Operator).field_0x1c;
      std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)&local_780)
      ;
      if (iVar2 == 1) {
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_790,lOp);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_7a0,(nullptr_t)0x0);
        addCmd(this,mov_dptr_const,&local_790,&local_7a0);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_7a0);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_790);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_7b0,(nullptr_t)0x0);
        p_Var1 = &local_7d0.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                  super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        std::shared_ptr<nigel::IM_Operator>::shared_ptr
                  ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
        addCmd(this,movx_a_dptr,&local_7b0,(shared_ptr<nigel::IM_Operator> *)p_Var1);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                  ((shared_ptr<nigel::IM_Operator> *)
                   &local_7d0.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                    super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_7b0);
      }
      else {
        std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)lOp);
        IM_Operator::as<nigel::IM_Variable>(&local_7d0);
        peVar4 = std::
                 __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_7d0);
        bVar5 = IM_Variable::isOnStack(peVar4);
        std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                  ((shared_ptr<nigel::IM_Variable> *)&local_7d0);
        if (bVar5) {
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_7e0,lOp);
          generateLoadStackR0(this,&local_7e0);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_7e0);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_7f0,(nullptr_t)0x0);
          p_Var1 = &local_810.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                    super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          std::shared_ptr<nigel::IM_Operator>::shared_ptr
                    ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
          addCmd(this,mov_a_atr0,&local_7f0,(shared_ptr<nigel::IM_Operator> *)p_Var1);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                    ((shared_ptr<nigel::IM_Operator> *)
                     &local_810.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                      super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_7f0);
        }
      }
    }
  }
  else if (comb == cv) {
    std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               rOp);
    IM_Operator::as<nigel::IM_Variable>(&local_810);
    peVar4 = std::__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_810);
    iVar2 = *(int *)&(peVar4->super_IM_Operator).field_0x1c;
    std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)&local_810);
    if (iVar2 == 0) {
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_820,rOp);
      IM_SFR::getSFR((SFR)&local_840);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_830,&local_840);
      addCmd(this,mov_adr_adr,&local_820,&local_830);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_830);
      std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_840);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_820);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_850,lOp);
      p_Var1 = &local_870.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      std::shared_ptr<nigel::IM_Operator>::shared_ptr
                ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
      addCmd(this,mov_a_const,&local_850,(shared_ptr<nigel::IM_Operator> *)p_Var1);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                ((shared_ptr<nigel::IM_Operator> *)
                 &local_870.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                  super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_850);
    }
    else {
      std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)rOp);
      IM_Operator::as<nigel::IM_Variable>(&local_870);
      peVar4 = std::
               __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_870);
      iVar2 = *(int *)&(peVar4->super_IM_Operator).field_0x1c;
      std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)&local_870)
      ;
      if (iVar2 == 1) {
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_880,rOp);
        IM_SFR::getSFR((SFR)&local_8a0);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_890,&local_8a0);
        addCmd(this,mov_adr_const,&local_880,&local_890);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_890);
        std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_8a0);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_880);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_8b0,lOp);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_8c0,(nullptr_t)0x0);
        addCmd(this,mov_dptr_const,&local_8b0,&local_8c0);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_8c0);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_8b0);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_8d0,(nullptr_t)0x0);
        p_Var1 = &local_8f0.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                  super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        std::shared_ptr<nigel::IM_Operator>::shared_ptr
                  ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
        addCmd(this,movx_a_dptr,&local_8d0,(shared_ptr<nigel::IM_Operator> *)p_Var1);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                  ((shared_ptr<nigel::IM_Operator> *)
                   &local_8f0.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                    super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_8d0);
      }
      else {
        std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)rOp);
        IM_Operator::as<nigel::IM_Variable>(&local_8f0);
        peVar4 = std::
                 __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_8f0);
        bVar5 = IM_Variable::isOnStack(peVar4);
        std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                  ((shared_ptr<nigel::IM_Variable> *)&local_8f0);
        if (bVar5) {
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_900,rOp);
          generateLoadStackR0(this,&local_900);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_900);
          IM_SFR::getSFR((SFR)&local_920);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_910,&local_920)
          ;
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_930,(nullptr_t)0x0);
          addCmd(this,mov_adr_atr0,&local_910,&local_930);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_930);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_910);
          std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_920);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_940,lOp);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_950,(nullptr_t)0x0);
          addCmd(this,mov_a_const,&local_940,&local_950);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_950);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_940);
        }
      }
    }
  }
  else if (comb == cc) {
    std::shared_ptr<nigel::Token>::shared_ptr(&local_960,token);
    BuilderExecutable::generateNotification
              (&this->super_BuilderExecutable,imp_operationOnTwoConstantsCanBePrevented,&local_960);
    std::shared_ptr<nigel::Token>::~shared_ptr(&local_960);
    IM_SFR::getSFR((SFR)&local_980);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_970,&local_980);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_990,rOp);
    addCmd(this,mov_adr_const,&local_970,&local_990);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_990);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_970);
    std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_980);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_9a0,lOp);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_9b0,(nullptr_t)0x0);
    addCmd(this,mov_a_const,&local_9a0,&local_9b0);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_9b0);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_9a0);
  }
  else if (comb == ct) {
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_9c0,lOp);
    p_Var1 = &local_9e0.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
              super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    std::shared_ptr<nigel::IM_Operator>::shared_ptr
              ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
    addCmd(this,mov_a_const,&local_9c0,(shared_ptr<nigel::IM_Operator> *)p_Var1);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr
              ((shared_ptr<nigel::IM_Operator> *)
               &local_9e0.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_9c0);
  }
  else if (comb == tv) {
    std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               rOp);
    IM_Operator::as<nigel::IM_Variable>(&local_9e0);
    peVar4 = std::__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_9e0);
    iVar2 = *(int *)&(peVar4->super_IM_Operator).field_0x1c;
    std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)&local_9e0);
    if (iVar2 == 0) {
      std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_9f0,rOp);
      IM_SFR::getSFR((int)&local_a20 + 0x10);
      std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>
                (&local_a00,
                 (shared_ptr<nigel::IM_SFR> *)
                 &local_a20.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                  super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      addCmd(this,mov_adr_adr,&local_9f0,&local_a00);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_a00);
      std::shared_ptr<nigel::IM_SFR>::~shared_ptr
                ((shared_ptr<nigel::IM_SFR> *)
                 &local_a20.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                  super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_9f0);
    }
    else {
      std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)rOp);
      IM_Operator::as<nigel::IM_Variable>(&local_a20);
      peVar4 = std::
               __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_a20);
      iVar2 = *(int *)&(peVar4->super_IM_Operator).field_0x1c;
      std::shared_ptr<nigel::IM_Variable>::~shared_ptr((shared_ptr<nigel::IM_Variable> *)&local_a20)
      ;
      if (iVar2 == 1) {
        IM_SFR::getSFR((SFR)&local_a40);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_a30,&local_a40);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_a50,(nullptr_t)0x0);
        addCmd(this,xch_a_adr,&local_a30,&local_a50);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_a50);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_a30);
        std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_a40);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_a60,rOp);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_a70,(nullptr_t)0x0);
        addCmd(this,mov_dptr_const,&local_a60,&local_a70);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_a70);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_a60);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_a80,(nullptr_t)0x0);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_a90,(nullptr_t)0x0);
        addCmd(this,movx_a_dptr,&local_a80,&local_a90);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_a90);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_a80);
        IM_SFR::getSFR((SFR)&local_ab0);
        std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_aa0,&local_ab0);
        p_Var1 = &local_ad0.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                  super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        std::shared_ptr<nigel::IM_Operator>::shared_ptr
                  ((shared_ptr<nigel::IM_Operator> *)p_Var1,(nullptr_t)0x0);
        addCmd(this,xch_a_adr,&local_aa0,(shared_ptr<nigel::IM_Operator> *)p_Var1);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr
                  ((shared_ptr<nigel::IM_Operator> *)
                   &local_ad0.super_enable_shared_from_this<nigel::IM_Operator>._M_weak_this.
                    super___weak_ptr<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_aa0);
        std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_ab0);
      }
      else {
        std::__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<nigel::IM_Operator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)rOp);
        IM_Operator::as<nigel::IM_Variable>(&local_ad0);
        peVar4 = std::
                 __shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<nigel::IM_Variable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&local_ad0);
        bVar5 = IM_Variable::isOnStack(peVar4);
        std::shared_ptr<nigel::IM_Variable>::~shared_ptr
                  ((shared_ptr<nigel::IM_Variable> *)&local_ad0);
        if (bVar5) {
          IM_SFR::getSFR((SFR)&local_af0);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_ae0,&local_af0)
          ;
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_b00,(nullptr_t)0x0);
          addCmd(this,push_adr,&local_ae0,&local_b00);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_b00);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_ae0);
          std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_af0);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_b10,rOp);
          generateLoadStackR0(this,&local_b10);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_b10);
          IM_SFR::getSFR((SFR)&local_b30);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_b20,&local_b30)
          ;
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_b40,(nullptr_t)0x0);
          addCmd(this,mov_adr_atr0,&local_b20,&local_b40);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_b40);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_b20);
          std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_b30);
          IM_SFR::getSFR((SFR)&local_b60);
          std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_b50,&local_b60)
          ;
          std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_b70,(nullptr_t)0x0);
          addCmd(this,pop_adr,&local_b50,&local_b70);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_b70);
          std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_b50);
          std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_b60);
        }
      }
    }
  }
  else if (comb == tc) {
    IM_SFR::getSFR((SFR)&local_b90);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr<nigel::IM_SFR,void>(&local_b80,&local_b90);
    std::shared_ptr<nigel::IM_Operator>::shared_ptr(&local_ba0,rOp);
    addCmd(this,mov_adr_const,&local_b80,&local_ba0);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_ba0);
    std::shared_ptr<nigel::IM_Operator>::~shared_ptr(&local_b80);
    std::shared_ptr<nigel::IM_SFR>::~shared_ptr(&local_b90);
  }
  return;
}

Assistant:

void IMC_Generator::generateMoveAB( OperationCombination comb, std::shared_ptr<IM_Operator> lOp, std::shared_ptr<IM_Operator> rOp, std::shared_ptr<Token> token )
	{
		if( comb == OC::vv )
		{
			if( lOp->as<IM_Variable>()->model == MemModel::fast &&
				rOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_adr_adr, rOp, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_a_adr, lOp );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large &&
					 rOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::mov_adr_adr, rOp, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() &&
				rOp->as<IM_Variable>()->model == MemModel::fast )
			{
				generateLoadStackR0( lOp );
				addCmd( HexOp::mov_adr_adr, rOp, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_a_atr0 );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::fast &&
					 rOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, rOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::mov_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_a_adr, lOp );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large &&
					 rOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, rOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::mov_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() &&
					 rOp->as<IM_Variable>()->model == MemModel::large )
			{
				generateLoadStackR0( lOp );
				addCmd( HexOp::mov_dptr_const, rOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::mov_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_a_atr0 );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::fast &&
					 rOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( rOp );
				addCmd( HexOp::mov_adr_atr0, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_a_adr, lOp );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large &&
					 rOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( rOp );
				addCmd( HexOp::mov_adr_atr0, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() &&
					 rOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( rOp );
				addCmd( HexOp::mov_adr_atr0, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				generateLoadStackR0( lOp );
				addCmd( HexOp::mov_a_atr0 );
			}
		}
		else if( comb == OC::vc )
		{
			if( lOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_adr_const, IM_SFR::getSFR( IM_SFR::SFR::B ), rOp );
				addCmd( HexOp::mov_a_adr, lOp );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_adr_const, IM_SFR::getSFR( IM_SFR::SFR::B ), rOp );
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( lOp );
				addCmd( HexOp::mov_adr_const, IM_SFR::getSFR( IM_SFR::SFR::B ), rOp );
				addCmd( HexOp::mov_a_atr0 );
			}
		}
		else if( comb == OC::vt )
		{
			if( lOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_a_adr, lOp );
			}
			else if( lOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
			}
			else if( lOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( lOp );
				addCmd( HexOp::mov_a_atr0 );
			}
		}
		else if( comb == OC::cv )
		{
			if( rOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_adr_adr, rOp, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_a_const, lOp );
			}
			else if( rOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::mov_adr_const, rOp, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_dptr_const, lOp );
				addCmd( HexOp::movx_a_dptr );
			}
			else if( rOp->as<IM_Variable>()->isOnStack() )
			{
				generateLoadStackR0( rOp );
				addCmd( HexOp::mov_adr_atr0, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_a_const, lOp );
			}
		}
		else if( comb == OC::cc )
		{
			generateNotification( NT::imp_operationOnTwoConstantsCanBePrevented, token );
			addCmd( HexOp::mov_adr_const, IM_SFR::getSFR( IM_SFR::SFR::B ), rOp );
			addCmd( HexOp::mov_a_const, lOp );
		}
		else if( comb == OC::ct )
		{
			addCmd( HexOp::mov_a_const, lOp );
		}
		else if( comb == OC::tv )
		{
			if( rOp->as<IM_Variable>()->model == MemModel::fast )
			{
				addCmd( HexOp::mov_adr_adr, rOp, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( rOp->as<IM_Variable>()->model == MemModel::large )
			{
				addCmd( HexOp::xch_adr_a, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::mov_dptr_const, rOp );
				addCmd( HexOp::movx_a_dptr );
				addCmd( HexOp::xch_a_adr, IM_SFR::getSFR( IM_SFR::SFR::B ) );
			}
			else if( rOp->as<IM_Variable>()->isOnStack() )
			{
				addCmd( HexOp::push_adr, IM_SFR::getSFR( IM_SFR::SFR::A ) );
				generateLoadStackR0( rOp );
				addCmd( HexOp::mov_adr_atr0, IM_SFR::getSFR( IM_SFR::SFR::B ) );
				addCmd( HexOp::pop_adr, IM_SFR::getSFR( IM_SFR::SFR::A ) );
			}
		}
		else if( comb == OC::tc )
		{
			addCmd( HexOp::mov_adr_const, IM_SFR::getSFR( IM_SFR::SFR::B ), rOp );
		}
		//Ignore OC::tt because it is already correct.
	}